

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofXyz.cpp
# Opt level: O0

void __thiscall
OpenMD::GofXyz::GofXyz
          (GofXyz *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3,
          RealType len,int nrbins)

{
  undefined1 uVar1;
  reference this_00;
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  SimInfo *in_stack_00000018;
  SelectionEvaluator *in_stack_00000020;
  uint j;
  uint i;
  SimInfo *in_stack_000001c8;
  SelectionManager *in_stack_000001d0;
  uint in_stack_0000025c;
  string *in_stack_00000260;
  string *in_stack_00000268;
  string *in_stack_00000270;
  SimInfo *in_stack_00000278;
  RadialDistrFunc *in_stack_00000280;
  string *in_stack_ffffffffffffff18;
  StaticAnalyser *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  SelectionManager *this_01;
  undefined8 *__new_size;
  vector<int,_std::allocator<int>_> *this_02;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff5c;
  uint uVar3;
  string *in_stack_ffffffffffffff68;
  SelectionEvaluator *in_stack_ffffffffffffff70;
  string local_88 [32];
  string local_68 [48];
  double local_38;
  
  local_38 = in_XMM0_Qa;
  RadialDistrFunc::RadialDistrFunc
            (in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
             in_stack_00000260,in_stack_0000025c);
  *in_RDI = &PTR__GofXyz_0055ee48;
  in_RDI[0x1f6] = local_38;
  in_RDI[0x1f7] = local_38 * 0.5;
  SelectionEvaluator::SelectionEvaluator(in_stack_00000020,in_stack_00000018);
  this_02 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x2a4);
  SelectionManager::SelectionManager(in_stack_000001d0,in_stack_000001c8);
  this_01 = (SelectionManager *)(in_RDI + 0x2bd);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)0x157d6f);
  __new_size = in_RDI + 0x2c0;
  std::
  map<int,_OpenMD::SquareMatrix3<double>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
  ::map((map<int,_OpenMD::SquareMatrix3<double>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
         *)0x157d85);
  getPrefix((string *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                 (char *)in_stack_ffffffffffffff20);
  StaticAnalyser::setOutputName(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1fa));
  if (!(bool)uVar1) {
    SelectionEvaluator::evaluate
              ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    SelectionManager::setSelectionSet
              (this_01,(SelectionSet *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
    SelectionSet::~SelectionSet((SelectionSet *)0x157e60);
  }
  in_RDI[0x1f9] = (double)in_RDI[0x1f6] / (double)*(uint *)((long)in_RDI + 0x34);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)this_02,(size_type)__new_size);
  for (uVar3 = 0; uVar3 < *(uint *)((long)in_RDI + 0x34); uVar3 = uVar3 + 1) {
    std::
    vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                  *)(in_RDI + 0x2bd),(ulong)uVar3);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)this_02,(size_type)__new_size);
    for (uVar2 = 0; uVar2 < *(uint *)((long)in_RDI + 0x34); uVar2 = uVar2 + 1) {
      this_00 = std::
                vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                              *)(in_RDI + 0x2bd),(ulong)uVar3);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](this_00,(ulong)uVar2);
      std::vector<int,_std::allocator<int>_>::resize(this_02,(size_type)__new_size);
    }
  }
  return;
}

Assistant:

GofXyz::GofXyz(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 const std::string& sele3, RealType len, int nrbins) :
      RadialDistrFunc(info, filename, sele1, sele2, nrbins),
      len_(len), halfLen_(len / 2), evaluator3_(info), seleMan3_(info) {
    setOutputName(getPrefix(filename) + ".gxyz");

    evaluator3_.loadScriptString(sele3);
    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    deltaR_ = len_ / nBins_;

    histogram_.resize(nBins_);
    for (unsigned int i = 0; i < nBins_; ++i) {
      histogram_[i].resize(nBins_);
      for (unsigned int j = 0; j < nBins_; ++j) {
        histogram_[i][j].resize(nBins_);
      }
    }
  }